

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O3

unique_ptr<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_> __thiscall
charls::jls_codec_factory<charls::decoder_strategy>::create_codec
          (jls_codec_factory<charls::decoder_strategy> *this,frame_info *frame,
          coding_parameters *parameters,jpegls_pc_parameters *preset_coding_parameters)

{
  interleave_mode iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  default_traits<unsigned_char,_unsigned_char> traits;
  default_traits<unsigned_short,_unsigned_short> traits_00;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
  *this_00;
  uint uVar8;
  int iVar9;
  undefined4 *in_R8;
  undefined4 local_60;
  int iStack_5c;
  int iStack_58;
  int32_t iStack_54;
  int32_t local_50;
  int local_4c;
  undefined4 local_48;
  __uniq_ptr_impl<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_> local_40
  ;
  coding_parameters *local_38;
  
  if (in_R8[4] == 0x40) {
    try_create_optimized_codec
              ((jls_codec_factory<charls::decoder_strategy> *)&local_60,frame,parameters);
    this_00 = (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
               *)CONCAT44(iStack_5c,local_60);
    *(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy> **
     )this = this_00;
    if (this_00 !=
        (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
         *)0x0) goto LAB_00106b6e;
  }
  iVar1 = parameters->interleave_mode;
  local_40._M_t.
  super__Tuple_impl<0UL,_charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>
  .super__Head_base<0UL,_charls::decoder_strategy_*,_false>._M_head_impl =
       (tuple<charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>)
       (tuple<charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>)this;
  local_38 = parameters;
  if ((int)iVar1 < 9) {
    if (0xf < iVar1 - Line) {
LAB_00106b91:
      __assert_fail("bits_per_sample > 0 && bits_per_sample <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/util.h"
                    ,0x1a7,"int32_t charls::calculate_maximum_sample_value(const int32_t)");
    }
    uVar8 = ~(-1 << ((byte)iVar1 & 0x1f));
    iVar2 = preset_coding_parameters->maximum_sample_value;
    uVar3 = in_R8[4];
    iVar9 = (int)(uVar8 + iVar2 * 2) / (iVar2 * 2 + 1) + 1;
    iVar5 = log2_ceil(iVar9);
    iVar6 = log2_ceil(uVar8);
    uVar4 = *in_R8;
    this_00 = (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
               *)operator_new(0x17c8);
    iVar7 = 8;
    if (8 < iVar6) {
      iVar7 = iVar6;
    }
    local_4c = (iVar7 + iVar6) * 2;
    traits.near_lossless = iVar2;
    traits.maximum_sample_value = uVar4;
    traits.reset_threshold = uVar3;
    traits.limit = local_4c;
    traits.range = iVar9;
    traits.quantized_bits_per_pixel = iVar5;
    traits.bits_per_pixel = iVar6;
    local_60 = uVar4;
    iStack_5c = iVar2;
    iStack_58 = iVar9;
    iStack_54 = iVar5;
    local_50 = iVar6;
    local_48 = uVar3;
    jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>::
    jls_codec((jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
               *)this_00,traits,(frame_info *)local_38,(coding_parameters *)preset_coding_parameters
             );
  }
  else {
    if (0x10 < iVar1) goto LAB_00106b91;
    uVar8 = ~(-1 << ((byte)iVar1 & 0x1f));
    iVar2 = preset_coding_parameters->maximum_sample_value;
    uVar3 = in_R8[4];
    iVar9 = (int)(uVar8 + iVar2 * 2) / (iVar2 * 2 + 1) + 1;
    iVar5 = log2_ceil(iVar9);
    iVar6 = log2_ceil(uVar8);
    uVar4 = *in_R8;
    this_00 = (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
               *)operator_new(0x17c8);
    iVar7 = 8;
    if (8 < iVar6) {
      iVar7 = iVar6;
    }
    local_4c = (iVar7 + iVar6) * 2;
    traits_00.near_lossless = iVar2;
    traits_00.maximum_sample_value = uVar4;
    traits_00.reset_threshold = uVar3;
    traits_00.limit = local_4c;
    traits_00.range = iVar9;
    traits_00.quantized_bits_per_pixel = iVar5;
    traits_00.bits_per_pixel = iVar6;
    local_60 = uVar4;
    iStack_5c = iVar2;
    iStack_58 = iVar9;
    iStack_54 = iVar5;
    local_50 = iVar6;
    local_48 = uVar3;
    jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>::
    jls_codec(this_00,traits_00,(frame_info *)local_38,(coding_parameters *)preset_coding_parameters
             );
  }
  *(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy> **)
   local_40._M_t.
   super__Tuple_impl<0UL,_charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>
   .super__Head_base<0UL,_charls::decoder_strategy_*,_false>._M_head_impl = this_00;
  this = (jls_codec_factory<charls::decoder_strategy> *)
         local_40._M_t.
         super__Tuple_impl<0UL,_charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>
         .super__Head_base<0UL,_charls::decoder_strategy_*,_false>._M_head_impl;
LAB_00106b6e:
  (*(this_00->super_decoder_strategy)._vptr_decoder_strategy[3])(this_00);
  return (__uniq_ptr_data<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>,_true,_true>
          )(tuple<charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>)this;
}

Assistant:

unique_ptr<Strategy> jls_codec_factory<Strategy>::create_codec(const frame_info& frame, const coding_parameters& parameters,
                                                               const jpegls_pc_parameters& preset_coding_parameters)
{
    unique_ptr<Strategy> codec;

    if (preset_coding_parameters.reset_value == default_reset_value)
    {
        codec = try_create_optimized_codec(frame, parameters);
    }

    if (!codec)
    {
        if (frame.bits_per_sample <= 8)
        {
            default_traits<uint8_t, uint8_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                    parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint8_t, uint8_t>, Strategy>>(traits, frame, parameters);
        }
        else
        {
            default_traits<uint16_t, uint16_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                      parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint16_t, uint16_t>, Strategy>>(traits, frame, parameters);
        }
    }

    codec->set_presets(preset_coding_parameters, parameters.restart_interval);
    return codec;
}